

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::SerializeWithCachedSizesToArray
          (CodeGeneratorResponse_File *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  char *pcVar4;
  string *psVar5;
  uint8 *puVar6;
  UnknownFieldSet *pUVar7;
  byte *local_d8;
  uint8 *target_local;
  CodeGeneratorResponse_File *this_local;
  byte *local_40;
  byte *local_28;
  uint8 *local_10;
  
  bVar1 = has_name(this);
  local_d8 = target;
  if (bVar1) {
    name_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = name_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(1,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_10 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_10 = target + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    local_d8 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_insertion_point(this);
  if (bVar1) {
    insertion_point_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    insertion_point_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = insertion_point_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *local_d8 = (byte)uVar3;
      local_28 = local_d8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_d8 = (byte)uVar3 | 0x80;
      local_d8[1] = (byte)(uVar3 >> 7);
      local_28 = local_d8 + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_d8);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_28);
    local_d8 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  bVar1 = has_content(this);
  if (bVar1) {
    content_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    content_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar4,iVar2,SERIALIZE);
    psVar5 = content_abi_cxx11_(this);
    uVar3 = internal::WireFormatLite::MakeTag(0xf,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *local_d8 = (byte)uVar3;
      local_40 = local_d8 + 1;
    }
    else if (uVar3 < 0x4000) {
      *local_d8 = (byte)uVar3 | 0x80;
      local_d8[1] = (byte)(uVar3 >> 7);
      local_40 = local_d8 + 2;
    }
    else {
      local_40 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,local_d8);
    }
    uVar3 = std::__cxx11::string::size();
    puVar6 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_40);
    local_d8 = io::CodedOutputStream::WriteStringToArray(psVar5,puVar6);
  }
  pUVar7 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar7);
  if (!bVar1) {
    pUVar7 = unknown_fields(this);
    local_d8 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar7,local_d8);
  }
  return local_d8;
}

Assistant:

::google::protobuf::uint8* CodeGeneratorResponse_File::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string insertion_point = 2;
  if (has_insertion_point()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->insertion_point().data(), this->insertion_point().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->insertion_point(), target);
  }

  // optional string content = 15;
  if (has_content()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->content().data(), this->content().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        15, this->content(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}